

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O3

bool API::checkDelete(STMT *stmt,int pos)

{
  _Rb_tree_color _Var1;
  int iVar2;
  int iVar3;
  TableInfo *pTVar4;
  pointer pbVar5;
  bool bVar6;
  iterator iVar7;
  ostream *poVar8;
  long *plVar9;
  pointer pcVar10;
  ulong uVar11;
  ostream *poVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  
  if (pos < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"delete fail,table ",0x12);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(stmt->tableName)._M_dataplus._M_p,
                         (stmt->tableName)._M_string_length);
    pcVar14 = " does not exist";
    lVar13 = 0xf;
LAB_00119ce6:
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar14,lVar13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    bVar6 = false;
  }
  else {
    pcVar10 = (stmt->c_list->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
              super__Vector_impl_data._M_start;
    bVar6 = true;
    if ((stmt->c_list->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
        super__Vector_impl_data._M_finish != pcVar10) {
      pTVar4 = CM.TableInfoList.super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
               _M_impl.super__Vector_impl_data._M_start[(uint)pos];
      lVar15 = 8;
      lVar13 = 0;
      uVar16 = 0;
      do {
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&(pTVar4->getID)._M_t,
                       (key_type *)((long)&(pcVar10->colunmName)._M_dataplus._M_p + lVar13));
        if ((_Rb_tree_header *)iVar7._M_node == &(pTVar4->getID)._M_t._M_impl.super__Rb_tree_header)
        {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"colunm ",7);
          pcVar10 = (stmt->c_list->super__Vector_base<condition,_std::allocator<condition>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          uVar11 = ((long)(stmt->c_list->super__Vector_base<condition,_std::allocator<condition>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pcVar10 >> 3) *
                   0x4ec4ec4ec4ec4ec5;
          if (uVar11 < uVar16 || uVar11 - uVar16 == 0) {
LAB_00119dfc:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar16);
          }
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               *(char **)((long)&(pcVar10->colunmName)._M_dataplus._M_p + lVar13),
                               *(long *)((long)&(pcVar10->colunmName)._M_string_length + lVar13));
          pcVar14 = "does not exist";
          lVar13 = 0xe;
          goto LAB_00119ce6;
        }
        pcVar10 = (stmt->c_list->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar11 = ((long)(stmt->c_list->super__Vector_base<condition,_std::allocator<condition>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pcVar10 >> 3) *
                 0x4ec4ec4ec4ec4ec5;
        if (uVar11 < uVar16 || uVar11 - uVar16 == 0) goto LAB_00119dfc;
        _Var1 = iVar7._M_node[2]._M_color;
        *(_Rb_tree_color *)((long)&pcVar10->colunmID + lVar13) = _Var1;
        iVar2 = *(int *)((long)&pcVar10->type + lVar13);
        iVar3 = (pTVar4->type).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(int)_Var1];
        if ((iVar2 != iVar3) && (((iVar3 < iVar2 || (iVar2 < 0x1d4c1)) || (iVar3 < 0x1d4c1)))) {
          pbVar5 = (pTVar4->attributeName).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          poVar12 = (ostream *)&std::cout;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,*(char **)((long)pbVar5 + lVar15 + -8),
                              *(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar15));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," type does not match",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"insert type is ",0xf);
          poVar8 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," while check type is ",0x15);
          plVar9 = (long *)std::ostream::operator<<(poVar8,iVar3);
          std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
          std::ostream::put((char)plVar9);
          std::ostream::flush();
          pcVar14 = "error occured";
          lVar13 = 0xd;
          goto LAB_00119ce6;
        }
        uVar16 = uVar16 + 1;
        lVar15 = lVar15 + 0x20;
        lVar13 = lVar13 + 0x68;
      } while (uVar16 <= uVar11 && uVar11 - uVar16 != 0);
      bVar6 = true;
    }
  }
  return bVar6;
}

Assistant:

bool API::checkDelete(STMT* stmt,int pos){
    if(pos < 0){
        std::cout<<"delete fail,table "<<stmt->tableName<<" does not exist"<<std::endl;
        return false;
    }
    TableInfo* info = CM.TableInfoList[pos];
    //增加id 增加类型检查
    bool error = false;
    for(int i = 0 ; i < stmt->c_list->size() ; i ++){
        //增加colunmid
        auto it = info->getID.find(stmt->c_list->at(i).colunmName);
        if(it==info->getID.end()){
            std::cout<<"colunm "<< stmt->c_list->at(i).colunmName << "does not exist"<<std::endl;
            return false;
        }
        else{
            stmt->c_list->at(i).colunmID = it->second;
        }
        //先检查类型
        int insertType = stmt->c_list->at(i).type;
        int checkType = info->type[it->second];
        if(insertType != checkType ){
            if(checkType > 120000 && insertType > 120000 && insertType <= checkType)continue;
            std::cout<<info->attributeName[i]<<" type does not match"<< std::endl;
            std::cout << "insert type is "<<insertType<<" while check type is "<<checkType<<std::endl;
            error = true;
        }
        if(error){
            std::cout<<"error occured"<<std::endl;
            return false;
        }
    }
    return true;
}